

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslerror.cpp
# Opt level: O0

QDebug print(QDebug *debug,SslError error)

{
  QSslError *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char16_t **this;
  QString *t;
  Stream *this_00;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  t = &local_28;
  this_00 = in_RDI;
  QSslError::QSslError((QSslError *)in_RDI,(SslError)((ulong)t >> 0x20));
  this = &local_28.d.ptr;
  QSslError::errorString(in_RSI);
  QDebug::operator<<((QDebug *)this_00,t);
  QString::~QString((QString *)0x397b75);
  QSslError::~QSslError((QSslError *)0x397b7f);
  QDebug::QDebug((QDebug *)this,(QDebug *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug print(QDebug debug, QSslError::SslError error)
{
    debug << QSslError(error).errorString();
    return debug;
}